

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int16_t tmp;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ushort *puVar19;
  
  if ((ext2[4] & 8U) != 0) {
    copy_val(new_ext,ext1,1);
    return;
  }
  if ((ext1[4] & 8U) != 0) {
    copy_val(new_ext,ext2,1);
    new_ext[4] = new_ext[4] | 1;
    return;
  }
  iVar5 = compare_abs(ext1,ext2);
  puVar19 = (ushort *)ext1;
  if (iVar5 < 0) {
    puVar19 = (ushort *)ext2;
    ext2 = ext1;
  }
  uVar1 = puVar19[1];
  uVar2 = *(ushort *)((long)ext2 + 2);
  uVar3 = uVar1;
  if ((short)uVar1 < (short)uVar2) {
    uVar3 = uVar2;
  }
  iVar14 = (int)(short)uVar3;
  *(ushort *)(new_ext + 2) = uVar3;
  iVar6 = (int)(short)puVar19[1];
  lVar11 = (long)iVar6 - (ulong)*puVar19;
  iVar7 = (int)(short)*(ushort *)((long)ext2 + 2);
  lVar10 = (long)iVar7;
  lVar13 = lVar10 - (ulong)*(ushort *)ext2;
  uVar3 = *(ushort *)new_ext;
  iVar12 = iVar14 - (uint)uVar3;
  iVar9 = 0;
  iVar18 = 0;
  if (((iVar12 <= iVar7) && (iVar18 = iVar9, (int)lVar13 < iVar12)) &&
     (iVar12 <= (int)lVar11 || iVar6 < iVar12)) {
    uVar8 = (uint)(int)*(char *)((long)ext2 + ((ulong)(long)(iVar7 - iVar12) >> 1) + 5) >>
            (~((char)(iVar7 - iVar12) * '\x04') & 4U) & 0xf;
    if (uVar8 < 6) {
      if (uVar8 != 5) goto LAB_0023cb09;
      lVar17 = (long)(short)uVar2;
      if ((long)(short)uVar2 < (long)(short)uVar1) {
        lVar17 = (long)(short)uVar1;
      }
      iVar7 = ((iVar7 + (uint)uVar3) - (int)lVar17) * 4;
      uVar15 = lVar10 - ((int)-(uint)uVar3 + lVar17);
      do {
        iVar7 = iVar7 + 4;
        uVar15 = uVar15 + 1;
        if (*(ushort *)ext2 <= uVar15) goto LAB_0023cb09;
      } while ((*(byte *)((long)ext2 + (uVar15 >> 1) + 5) >> (~(byte)iVar7 & 4) & 0xf) == 0);
    }
    iVar18 = -1;
  }
LAB_0023cb09:
  uVar8 = (uint)uVar3;
  if (uVar8 != 0) {
    if ((short)uVar2 < (short)uVar1) {
      uVar2 = uVar1;
    }
    uVar16 = (uint)(short)uVar2;
    lVar17 = (long)(int)uVar16 - (ulong)uVar3;
    iVar7 = ~uVar16 + uVar8;
    uVar15 = (ulong)(int)((iVar14 + uVar8) - uVar16);
    do {
      uVar15 = uVar15 - 1;
      uVar8 = 0;
      if ((lVar11 <= lVar17) && (uVar8 = 0, lVar17 < iVar6)) {
        uVar8 = (uint)(int)*(char *)((long)puVar19 +
                                    ((ulong)(long)((short)puVar19[1] + iVar7) >> 1) + 5) >>
                (~((char)((short)puVar19[1] + iVar7) * '\x04') & 4U) & 0xf;
      }
      if ((lVar13 <= lVar17) && (lVar17 < lVar10)) {
        uVar8 = uVar8 - ((uint)(int)*(char *)((long)ext2 +
                                             ((ulong)(long)((short)*(ushort *)((long)ext2 + 2) +
                                                           iVar7) >> 1) + 5) >>
                         (~((char)((short)*(ushort *)((long)ext2 + 2) + iVar7) * '\x04') & 4U) & 0xf
                        );
      }
      uVar16 = iVar18 + uVar8;
      iVar9 = iVar18 + uVar8;
      iVar18 = (int)uVar16 >> 0x1f;
      uVar8 = iVar9 + 10;
      if (-1 < (int)uVar16) {
        uVar8 = uVar16;
      }
      bVar4 = (byte)uVar15 & 1;
      new_ext[(uVar15 >> 1) + 5] =
           (byte)((uVar8 & 0xf) << (bVar4 * '\x04' ^ 4)) |
           '\x0f' << (bVar4 << 2) & new_ext[(uVar15 >> 1) + 5];
      lVar17 = lVar17 + 1;
      iVar7 = iVar7 + -1;
    } while (lVar17 < iVar14);
  }
  new_ext[4] = (byte)((uint)iVar5 >> 0x1f) | new_ext[4] & 0xfeU;
  normalize(new_ext);
  return;
}

Assistant:

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,
                                         const char *ext1, const char *ext2)
{
    int max_exp;
    int lo1, hi1;
    int lo2, hi2;
    int lo3, hi3;
    int pos;
    int result_neg = FALSE;
    int borrow;

    /* if we're subtracting zero or from zero, it's easy */
    if (is_zero(ext2))
    {
        /* 
         *   we're subtracting zero from another value - the result is
         *   simply the first value 
         */
        copy_val(new_ext, ext1, TRUE);
        return;
    }
    else if (is_zero(ext1))
    {
        /* 
         *   We're subtracting a value from zero - we know the value we're
         *   subtracting is non-zero (we already checked for that case
         *   above), and we're only considering the absolute values, so
         *   simply return the negative of the absolute value of the
         *   second operand.  
         */
        copy_val(new_ext, ext2, TRUE);
        set_neg(new_ext, TRUE);
        return;
    }

    /*
     *   Compare the absolute values of the two operands.  If the first
     *   value is larger than the second, subtract them in the given
     *   order.  Otherwise, reverse the order and note that the result is
     *   negative. 
     */
    if (compare_abs(ext1, ext2) < 0)
    {
        const char *tmp;
        
        /* the result will be negative */
        result_neg = TRUE;

        /* swap the order of the subtraction */
        tmp = ext1;
        ext1 = ext2;
        ext2 = tmp;
    }

    /* 
     *   start the new value with the larger of the two exponents - this
     *   will have the desired effect of dropping the least significant
     *   digits if any digits must be dropped 
     */
    max_exp = get_exp(ext1);
    if (get_exp(ext2) > max_exp)
        max_exp = get_exp(ext2);
    set_exp(new_ext, max_exp);

    /* compute the digit positions at the bounds of each of our values */
    hi1 = get_exp(ext1) - 1;
    lo1 = get_exp(ext1) - get_prec(ext1);

    hi2 = get_exp(ext2) - 1;
    lo2 = get_exp(ext2) - get_prec(ext2);

    hi3 = get_exp(new_ext) - 1;
    lo3 = get_exp(new_ext) - get_prec(new_ext);

    /* start off with no borrow */
    borrow = 0;

    /*
     *   Check for borrowing from before the least significant digit
     *   position in common to both numbers 
     */
    if (lo3-1 >= lo1 && lo3-1 <= hi1)
    {
        /* 
         *   In this case, we would be dropping precision from the end of
         *   the top number.  This case should never happen - the only way
         *   it could happen is for the bottom number to extend to the
         *   left of the top number at the most significant end.  This
         *   cannot happen because the bottom number always has small
         *   magnitude by this point (we guarantee this above).  So, we
         *   should never get here.
         */
        assert(FALSE);
    }
    else if (lo3-1 >= lo2 && lo3-1 <= hi2)
    {
        size_t idx;
        
        /*
         *   We're dropping precision from the bottom number, so we want
         *   to borrow into the subtraction if the rest of the number is
         *   greater than 5xxxx.  If it's exactly 5000..., do not borrow,
         *   since the result would end in 5 and we'd round up.
         *   
         *   If the next digit is 6 or greater, we know for a fact we'll
         *   have to borrow.  If the next digit is 4 or less, we know for
         *   a fact we won't have to borrow.  If the next digit is 5,
         *   though, we must look at the rest of the number to see if
         *   there's anything but trailing zeros.  
         */
        idx = (size_t)(get_exp(ext2) - (lo3-1) - 1);
        if (get_dig(ext2, idx) >= 6)
        {
            /* definitely borrow */
            borrow = 1;
        }
        else if (get_dig(ext2, idx) == 5)
        {
            /* borrow only if we have something non-zero following */
            for (++idx ; idx < get_prec(ext2) ; ++idx)
            {
                /* if it's non-zero, we must borrow */
                if (get_dig(ext2, idx) != 0)
                {
                    /* note the borrow */
                    borrow = 1;

                    /* no need to keep scanning */
                    break;
                }
            }
        }
    }

    /* subtract the digits from least to most significant */
    for (pos = lo3 ; pos <= hi3 ; ++pos)
    {
        int acc;

        /* start with zero in the accumulator */
        acc = 0;

        /* start with the top-line value if it's represented here */
        if (pos >= lo1 && pos <= hi1)
            acc = get_dig(ext1, get_exp(ext1) - pos - 1);

        /* subtract the second value digit if it's represented here */
        if (pos >= lo2 && pos <= hi2)
            acc -= get_dig(ext2, get_exp(ext2) - pos - 1);

        /* subtract the borrow */
        acc -= borrow;

        /* check for borrow */
        if (acc < 0)
        {
            /* increase the accumulator */
            acc += 10;

            /* we must borrow from the next digit up */
            borrow = 1;
        }
        else
        {
            /* we're in range - no need to borrow */
            borrow = 0;
        }

        /* set the digit in the result */
        set_dig(new_ext, get_exp(new_ext) - pos - 1, acc);
    }

    /* set the sign of the result as calculated earlier */
    set_neg(new_ext, result_neg);

    /* normalize the number */
    normalize(new_ext);
}